

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O0

void learn(ect *e,single_learner *base,example *ec)

{
  undefined4 uVar1;
  single_learner *in_RDX;
  ect *in_RSI;
  uint32_t pred;
  label_t mc;
  example *in_stack_00000060;
  single_learner *in_stack_00000068;
  ect *in_stack_00000070;
  example *ec_00;
  
  ec_00 = *(example **)(in_RDX + 0x6828);
  predict(in_RSI,in_RDX,ec_00);
  uVar1 = *(undefined4 *)(in_RDX + 0x6850);
  if ((int)ec_00 != -1) {
    ect_train(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  }
  *(example **)(in_RDX + 0x6828) = ec_00;
  *(undefined4 *)(in_RDX + 0x6850) = uVar1;
  return;
}

Assistant:

void learn(ect& e, single_learner& base, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;
  predict(e, base, ec);
  uint32_t pred = ec.pred.multiclass;

  if (mc.label != (uint32_t)-1)
    ect_train(e, base, ec);
  ec.l.multi = mc;
  ec.pred.multiclass = pred;
}